

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::ZSobolSampler::ZSobolSampler
          (ZSobolSampler *this,int samplesPerPixel,Point2i fullResolution,
          RandomizeStrategy randomizeStrategy,int seed)

{
  int32_t iVar1;
  int v;
  int samplesPerPixel_local;
  
  this->randomizeStrategy = randomizeStrategy;
  this->seed = seed;
  samplesPerPixel_local = samplesPerPixel;
  if (POPCOUNT(samplesPerPixel) != 1) {
    Warning<int&>("Rounding %d up to the next power of two for \"zsobol\" sampler samples per pixel."
                  ,&samplesPerPixel_local);
    samplesPerPixel_local = RoundUpPow2(samplesPerPixel_local);
  }
  v = fullResolution.super_Tuple2<pbrt::Point2,_int>.y;
  if (fullResolution.super_Tuple2<pbrt::Point2,_int>.y <
      fullResolution.super_Tuple2<pbrt::Point2,_int>.x) {
    v = fullResolution.super_Tuple2<pbrt::Point2,_int>.x;
  }
  this->log2SamplesPerPixel = LZCOUNT(samplesPerPixel_local) ^ 0x1f;
  iVar1 = RoundUpPow2(v);
  this->nBase4Digits = (LZCOUNT(iVar1) ^ 0x1fU) + (this->log2SamplesPerPixel + 1) / 2;
  return;
}

Assistant:

ZSobolSampler(int samplesPerPixel, Point2i fullResolution,
                  RandomizeStrategy randomizeStrategy = RandomizeStrategy::PermuteDigits,
                  int seed = 0)
        : randomizeStrategy(randomizeStrategy), seed(seed) {
        if (!IsPowerOf2(samplesPerPixel)) {
            Warning("Rounding %d up to the next power of two for \"zsobol\" sampler "
                    "samples per pixel.",
                    samplesPerPixel);
            samplesPerPixel = RoundUpPow2(samplesPerPixel);
        }
        log2SamplesPerPixel = Log2Int(samplesPerPixel);

        int res = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
        int log4SamplesPerPixel = (log2SamplesPerPixel + 1) / 2;
        nBase4Digits = Log2Int(res) + log4SamplesPerPixel;
    }